

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

uint8 * __thiscall UnifiedRegex::Compiler::Emit(Compiler *this,size_t size)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint *puVar5;
  uint8 *puVar6;
  uint8 *inst;
  CharCount instLenPlus;
  CharCount newLen;
  size_t size_local;
  Compiler *this_local;
  
  if (0xffffffff < size) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x18,"(size <= (4294967295U))","size <= UINT32_MAX");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  if (this->instLen - this->instNext < size) {
    puVar5 = max<unsigned_int>(&this->instLen,&initInstBufSize);
    inst._4_4_ = *puVar5;
    uVar3 = (this->instLen + (int)size) - 1;
    if ((uVar3 < this->instLen) || (uVar3 * 2 < uVar3)) {
      Js::Throw::OutOfMemory();
    }
    for (; inst._4_4_ <= uVar3; inst._4_4_ = inst._4_4_ << 1) {
    }
    puVar6 = (uint8 *)Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                      Realloc(&this->ctAllocator->
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                              ,this->instBuf,(ulong)this->instLen,(ulong)inst._4_4_);
    this->instBuf = puVar6;
    this->instLen = inst._4_4_;
  }
  uVar3 = this->instNext;
  this->instNext = (int)size + this->instNext;
  return this->instBuf + uVar3;
}

Assistant:

uint8* Compiler::Emit(size_t size)
    {
        Assert(size <= UINT32_MAX);

        if (instLen - instNext < size)
        {
            CharCount newLen = max(instLen, initInstBufSize);
            CharCount instLenPlus = (CharCount)(instLen + size - 1);

            // check for overflow
            if (instLenPlus < instLen || instLenPlus * 2 < instLenPlus)
            {
                Js::Throw::OutOfMemory();
            }

            while (newLen <= instLenPlus)
            {
                newLen *= 2;
            }

            instBuf = (uint8*)ctAllocator->Realloc(instBuf, instLen, newLen);
            instLen = newLen;
        }
        uint8* inst = instBuf + instNext;
        instNext += (CharCount)size;
        return inst;
    }